

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>::format
          (short_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  fmt_helper *this_00;
  memory_buf_t *dest_00;
  string_view_t view;
  size_t local_c8;
  undefined1 local_98 [8];
  scoped_padder p;
  size_t text_size;
  char *filename;
  scoped_padder p_1;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  short_filename_formatter<spdlog::details::scoped_padder> *this_local;
  
  p_1.spaces_.size_ = (size_t)dest;
  bVar1 = source_loc::empty(&msg->source);
  if (bVar1) {
    scoped_padder::scoped_padder
              ((scoped_padder *)&filename,0,&(this->super_flag_formatter).padinfo_,
               (memory_buf_t *)p_1.spaces_.size_);
    scoped_padder::~scoped_padder((scoped_padder *)&filename);
  }
  else {
    this_00 = (fmt_helper *)basename((msg->source).filename);
    bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
    if (bVar1) {
      local_c8 = std::char_traits<char>::length((char_type *)this_00);
    }
    else {
      local_c8 = 0;
    }
    p.spaces_.size_ = local_c8;
    scoped_padder::scoped_padder
              ((scoped_padder *)local_98,local_c8,&(this->super_flag_formatter).padinfo_,
               (memory_buf_t *)p_1.spaces_.size_);
    dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)this_00);
    view.size_ = p_1.spaces_.size_;
    view.data_ = (char *)dest_00;
    fmt_helper::append_string_view(this_00,view,dest_00);
    scoped_padder::~scoped_padder((scoped_padder *)local_98);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }